

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O0

void __thiscall
gss::innards::Proof::create_cp_variable
          (Proof *this,int pattern_vertex,int target_size,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
          *pattern_name,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
          *target_name)

{
  pointer pIVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  undefined1 uVar4;
  int in_EDX;
  int in_ESI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
  pVar6;
  long m;
  int i_2;
  stringstream am1_constraint;
  long n;
  int i_1;
  stringstream al1_constraint;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9f8;
  undefined7 in_stack_fffffffffffffa00;
  undefined1 in_stack_fffffffffffffa07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa08;
  map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffa10;
  map<long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this_00;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
  *in_stack_fffffffffffffa18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa30;
  mapped_type *in_stack_fffffffffffffa38;
  map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffa40;
  map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  long local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  map<long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_4c8;
  string local_4c0 [32];
  pair<long,_long> local_4a0;
  int local_48c;
  stringstream local_488 [16];
  ostream local_478 [376];
  _Base_ptr local_300;
  undefined1 local_2f8;
  long local_2d0;
  long local_298;
  string local_290 [32];
  pair<long,_long> local_270;
  int local_25c;
  stringstream local_258 [16];
  ostream local_248 [376];
  _Base_ptr local_d0;
  undefined1 local_c8;
  pair<int,_int> local_2c;
  int local_24 [5];
  int local_10;
  int local_c [3];
  
  local_10 = in_EDX;
  local_c[0] = in_ESI;
  for (local_24[0] = 0; local_24[0] < local_10; local_24[0] = local_24[0] + 1) {
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x18bcd9);
    std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_2c,local_c,local_24);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
    ::operator()(in_stack_fffffffffffffa18,(int)((ulong)in_stack_fffffffffffffa10 >> 0x20));
    std::operator+(in_stack_fffffffffffffa08,
                   (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
    ::operator()(in_stack_fffffffffffffa18,(int)((ulong)in_stack_fffffffffffffa10 >> 0x20));
    std::operator+(in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
    pVar5 = std::
            map<std::pair<long,long>,std::__cxx11::string,std::less<std::pair<long,long>>,std::allocator<std::pair<std::pair<long,long>const,std::__cxx11::string>>>
            ::emplace<std::pair<int,int>,std::__cxx11::string>
                      (in_stack_fffffffffffffa10,(pair<int,_int> *)in_stack_fffffffffffffa08,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
    local_d0 = (_Base_ptr)pVar5.first._M_node;
    local_c8 = pVar5.second;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
  }
  pIVar1 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x18beb5);
  poVar2 = std::operator<<((ostream *)&pIVar1->field_0x50,"* vertex ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_c[0]);
  std::operator<<(poVar2," domain\n");
  std::__cxx11::stringstream::stringstream(local_258);
  for (local_25c = 0; local_25c < local_10; local_25c = local_25c + 1) {
    poVar2 = std::operator<<(local_248,"1 x");
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x18bf41);
    std::pair<long,_long>::pair<int_&,_int_&,_true>(&local_270,local_c,&local_25c);
    pmVar3 = std::
             map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](in_stack_fffffffffffffa40,(key_type *)in_stack_fffffffffffffa38);
    poVar2 = std::operator<<(poVar2,(string *)pmVar3);
    std::operator<<(poVar2," ");
  }
  std::operator<<(local_248,">= 1");
  pIVar1 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x18c016);
  std::__cxx11::stringstream::str();
  poVar2 = std::operator<<((ostream *)&pIVar1->field_0x50,local_290);
  std::operator<<(poVar2," ;\n");
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
  pIVar1 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x18c088);
  local_298 = pIVar1->nb_constraints + 1;
  pIVar1->nb_constraints = local_298;
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x18c0b2);
  pIVar1 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x18c0ca);
  if ((pIVar1->recover_encoding & 1U) == 0) {
    local_598 = local_298;
  }
  else {
    local_598 = 0;
  }
  local_2d0 = local_598;
  std::__cxx11::stringstream::str();
  std::
  tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  tuple<long_&,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
            ((tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffa10,(long *)in_stack_fffffffffffffa08,
             (long *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
             in_stack_fffffffffffff9f8);
  pVar6 = std::
          map<long,std::tuple<long,long,std::__cxx11::string>,std::less<long>,std::allocator<std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>>>
          ::emplace<int&,std::tuple<long,long,std::__cxx11::string>>
                    ((map<long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)in_stack_fffffffffffffa10,(int *)in_stack_fffffffffffffa08,
                     (tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
  local_300 = (_Base_ptr)pVar6.first._M_node;
  local_2f8 = pVar6.second;
  std::
  tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~tuple((tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x18c17e);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
  std::__cxx11::stringstream::stringstream(local_488);
  for (local_48c = 0; local_48c < local_10; local_48c = local_48c + 1) {
    poVar2 = std::operator<<(local_478,"-1 x");
    pIVar1 = std::
             unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
             operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x18c1e1);
    this_01 = &pIVar1->variable_mappings;
    std::pair<long,_long>::pair<int_&,_int_&,_true>(&local_4a0,local_c,&local_48c);
    in_stack_fffffffffffffa38 =
         std::
         map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[](this_01,(key_type *)in_stack_fffffffffffffa38);
    poVar2 = std::operator<<(poVar2,(string *)in_stack_fffffffffffffa38);
    std::operator<<(poVar2," ");
  }
  std::operator<<(local_478,">= -1");
  pIVar1 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x18c2fa);
  std::__cxx11::stringstream::str();
  poVar2 = std::operator<<((ostream *)&pIVar1->field_0x50,local_4c0);
  std::operator<<(poVar2," ;\n");
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
  pIVar1 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x18c360);
  local_4c8 = (map<long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)(pIVar1->nb_constraints + 1);
  pIVar1->nb_constraints = (long)local_4c8;
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x18c38a);
  pIVar1 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x18c3a2);
  this_00 = local_4c8;
  if ((pIVar1->recover_encoding & 1U) != 0) {
    this_00 = (map<long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)0x0;
  }
  std::__cxx11::stringstream::str();
  std::
  tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  tuple<long_&,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
            ((tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00,(long *)in_stack_fffffffffffffa08,
             (long *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),&local_4f8);
  pVar6 = std::
          map<long,std::tuple<long,long,std::__cxx11::string>,std::less<long>,std::allocator<std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>>>
          ::emplace<int&,std::tuple<long,long,std::__cxx11::string>>
                    (this_00,(int *)in_stack_fffffffffffffa08,
                     (tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
  uVar4 = pVar6.second;
  std::
  tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~tuple((tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x18c454);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar4,in_stack_fffffffffffffa00));
  std::__cxx11::stringstream::~stringstream(local_488);
  std::__cxx11::stringstream::~stringstream(local_258);
  return;
}

Assistant:

auto Proof::create_cp_variable(int pattern_vertex, int target_size,
    const function<auto(int)->string> & pattern_name,
    const function<auto(int)->string> & target_name) -> void
{
    for (int i = 0; i < target_size; ++i)
        _imp->variable_mappings.emplace(pair{pattern_vertex, i}, pattern_name(pattern_vertex) + "_" + target_name(i));

    _imp->model_stream << "* vertex " << pattern_vertex << " domain\n";
    stringstream al1_constraint;
    for (int i = 0; i < target_size; ++i)
        al1_constraint << "1 x" << _imp->variable_mappings[{pattern_vertex, i}] << " ";
    al1_constraint << ">= 1";
    _imp->model_stream << al1_constraint.str() << " ;\n";
    long n = ++_imp->nb_constraints;
    _imp->at_least_one_value_constraints.emplace(pattern_vertex, tuple{n, _imp->recover_encoding ? 0 : n, al1_constraint.str()});

    stringstream am1_constraint;
    for (int i = 0; i < target_size; ++i)
        am1_constraint << "-1 x" << _imp->variable_mappings[{pattern_vertex, i}] << " ";
    am1_constraint << ">= -1";
    _imp->model_stream << am1_constraint.str() << " ;\n";
    long m = ++_imp->nb_constraints;
    _imp->at_most_one_value_constraints.emplace(pattern_vertex, tuple{m, _imp->recover_encoding ? 0 : m, am1_constraint.str()});
}